

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_file_name.hpp
# Opt level: O1

size_t pstore::
       process_file_name<unsigned_long(*)(pstore::gsl::span<char,_1l>),std::vector<char,std::allocator<char>>>
                 (_func_unsigned_long_span<char,__1L> *get_process_path,
                 vector<char,_std::allocator<char>_> *buffer)

{
  pointer pcVar1;
  ulong uVar2;
  unsigned_long uVar3;
  ulong __new_size;
  span<char,__1L> sVar4;
  extent_type<_1L> local_38 [2];
  
  uVar2 = (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage -
          (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  __new_size = 2;
  if (2 < uVar2) {
    __new_size = uVar2;
  }
  do {
    while( true ) {
      std::vector<char,_std::allocator<char>_>::resize(buffer,__new_size);
      pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      gsl::details::extent_type<-1L>::extent_type
                (local_38,(long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pcVar1);
      sVar4.storage_.data_ = pcVar1;
      sVar4.storage_.super_extent_type<_1L>.size_ = local_38[0].size_;
      uVar3 = (*get_process_path)(sVar4);
      uVar2 = (__new_size >> 1) + __new_size;
      __new_size = uVar2;
      if (uVar2 < uVar3) {
        __new_size = uVar3;
      }
      if (uVar3 == 0) break;
      if ((0xffffff < __new_size) ||
         (uVar3 < (ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start))) goto LAB_001626f8;
    }
  } while (uVar2 < 0x1000000);
LAB_001626f8:
  if (0xffffff < __new_size) {
    raise<pstore::error_code>(unknown_process_path);
  }
  return uVar3;
}

Assistant:

std::size_t process_file_name (ProcessPathFunction get_process_path, BufferType & buffer) {
        static_assert (std::is_same<typename BufferType::value_type, char>::value,
                       "BufferType::value_type must be char");
        constexpr auto const max_reasonable_size = std::size_t{16 * 1024 * 1024};
        auto size = std::size_t{0};
        auto next_size = std::max (buffer.capacity (), std::size_t{2});
        do {
            buffer.resize (next_size);
            size = get_process_path (::pstore::gsl::make_span (buffer));
            next_size = std::max (size, next_size + next_size / 2U);
        } while ((size == 0 || size >= buffer.size ()) && next_size < max_reasonable_size);
        if (next_size >= max_reasonable_size) {
            raise (error_code::unknown_process_path);
        }
        return size;
    }